

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalsList.h
# Opt level: O2

IntervalsList * __thiscall
dg::dda::IntervalsList::intersectWith(IntervalsList *this,IntervalsList *rhs)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  const_iterator __position;
  _List_node_base *p_Var4;
  
  __position._M_node =
       (this->intervals).
       super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (_List_node_base *)rhs;
  if (__position._M_node != (_List_node_base *)this) {
    while (p_Var4 = (((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                       *)&p_Var4->_M_next)->
                    super__List_base<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
                    )._M_impl._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)rhs) {
      while( true ) {
        p_Var2 = __position._M_node[1]._M_prev;
        p_Var3 = p_Var4[1]._M_next;
        if (p_Var3 <= p_Var2) break;
        p_Var2 = (__position._M_node)->_M_next;
        std::__cxx11::
        list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>::
        erase(&this->intervals,__position);
        __position._M_node = p_Var2;
        if (p_Var2 == (_List_node_base *)this) {
          return this;
        }
      }
      p_Var1 = __position._M_node[1]._M_next;
      if (p_Var1 <= *(_List_node_base **)((long)(p_Var4 + 1) + 8)) {
        if (p_Var3 < p_Var1) {
          p_Var3 = p_Var1;
        }
        __position._M_node[1]._M_next = p_Var3;
        if (*(_List_node_base **)((long)(p_Var4 + 1) + 8) < p_Var2) {
          p_Var2 = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
        }
        __position._M_node[1]._M_prev = p_Var2;
      }
    }
  }
  return this;
}

Assistant:

IntervalsList &intersectWith(const IntervalsList &rhs) {
        if (intervals.empty())
            return *this;

        auto it = intervals.begin();
        for (const auto &RI : rhs.intervals) {
            while (it->end < RI.start) {
                auto tmp = it++;
                intervals.erase(tmp);
                if (it == intervals.end()) {
                    return *this;
                }
            }
            if (it->overlaps(RI)) {
                it->start = std::max(it->start, RI.start);
                it->end = std::min(it->end, RI.end);
            }
        }

        return *this;
    }